

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  xpath_value_type xVar1;
  xpath_variable_set *this_01;
  char_t *pcVar2;
  bool *pbVar3;
  double dVar4;
  char cVar5;
  byte bVar6;
  nodetest_t nVar7;
  size_t length;
  byte *pbVar8;
  xpath_ast_node *pxVar9;
  xpath_variable *__dest;
  char_t *pcVar10;
  xpath_ast_node *pxVar11;
  xpath_ast_node *pxVar12;
  xpath_parse_result *pxVar13;
  xpath_ast_node *pxVar14;
  long lVar15;
  bool bVar16;
  lexeme_t lVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  size_t __n;
  xpath_ast_node *args [2];
  bool local_59;
  xpath_ast_node *local_48 [3];
  
  lVar17 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar17 - lex_minus) {
switchD_00129606_caseD_9:
    pxVar9 = parse_location_path(this);
    return pxVar9;
  }
  this_00 = &this->_lexer;
  switch(lVar17) {
  case lex_minus:
    xpath_lexer::next(this_00);
    pxVar9 = parse_expression(this,7);
    if (pxVar9 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar12 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar12->_type = '\x0e';
    pxVar12->_rettype = '\x02';
    pxVar12->_axis = '\0';
    pxVar12->_test = '\0';
    pxVar12->_left = pxVar9;
    pxVar12->_right = (xpath_ast_node *)0x0;
    pxVar12->_next = (xpath_ast_node *)0x0;
    return pxVar12;
  default:
    goto switchD_00129606_caseD_9;
  case lex_var_ref:
switchD_00129606_caseD_b:
    this_01 = this->_variables;
    if (this_01 == (xpath_variable_set *)0x0) {
      pxVar13 = this->_result;
      pcVar18 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar20 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      pcVar10 = this->_scratch;
      if ((0x1f < uVar20) &&
         (pcVar10 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar20 + 1), pcVar10 == (char_t *)0x0)) {
LAB_00129988:
        pbVar3 = this->_alloc->_error;
        if (pbVar3 != (bool *)0x0) {
          *pbVar3 = true;
          return (xpath_ast_node *)0x0;
        }
        __assert_fail("_alloc->_error",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                      ,0x2b42,
                      "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::error_oom()"
                     );
      }
      memcpy(pcVar10,pcVar2,uVar20);
      pcVar10[uVar20] = '\0';
      __dest = xpath_variable_set::_find(this_01,pcVar10);
      if (pcVar10 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar10);
      }
      if (__dest != (xpath_variable *)0x0) {
        xpath_lexer::next(this_00);
        xVar1 = __dest->_type;
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '\x14';
        pxVar11->_rettype = (char)xVar1;
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
        goto LAB_001298ca;
      }
      pxVar13 = this->_result;
      pcVar18 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_00129606_caseD_c:
    xpath_lexer::next(this_00);
    pxVar11 = parse_expression(this,0);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_00);
      goto LAB_001298de;
    }
    pxVar13 = this->_result;
    pcVar18 = "Expected \')\' to match an opening \'(\'";
    break;
  case lex_quoted_string:
switchD_00129606_caseD_e:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar2 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x130449;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
      *(char *)((long)__dest + __n) = '\0';
    }
    xpath_lexer::next(this_00);
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x12';
    pxVar11->_rettype = '\x03';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
LAB_001298ca:
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).string = (char_t *)__dest;
    goto LAB_001298de;
  case lex_number:
switchD_00129606_caseD_f:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar20 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
    pcVar10 = this->_scratch;
    if ((0x1f < uVar20) &&
       (pcVar10 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar20 + 1), pcVar10 == (char_t *)0x0)) goto LAB_00129988;
    memcpy(pcVar10,pcVar2,uVar20);
    pcVar10[uVar20] = '\0';
    dVar4 = convert_string_to_number(pcVar10);
    if (pcVar10 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar10);
    }
    xpath_lexer::next(this_00);
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x13';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    pxVar11->_left = (xpath_ast_node *)0x0;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    (pxVar11->_data).number = dVar4;
    goto LAB_001298de;
  case lex_string:
    pbVar8 = (byte *)this_00->_cur;
    do {
      bVar6 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar6] & 8) != 0);
    if ((bVar6 != 0x28) ||
       (nVar7 = parse_node_test_type
                          ((xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin,
                           (xpath_lexer_string *)(this->_lexer)._cur_lexeme_contents.end),
       nVar7 != nodetest_none)) goto switchD_00129606_caseD_9;
    switch(lVar17) {
    case lex_var_ref:
      goto switchD_00129606_caseD_b;
    case lex_open_brace:
      goto switchD_00129606_caseD_c;
    default:
      pxVar13 = this->_result;
      pcVar18 = "Unrecognizable primary expression";
      break;
    case lex_quoted_string:
      goto switchD_00129606_caseD_e;
    case lex_number:
      goto switchD_00129606_caseD_f;
    case lex_string:
      goto switchD_001296b6_caseD_14;
    }
  }
  goto LAB_00129a29;
switchD_001296b6_caseD_14:
  local_48[0] = (xpath_ast_node *)0x0;
  local_48[1] = (xpath_ast_node *)0x0;
  pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
  pcVar10 = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_00);
  if ((this->_lexer)._cur_lexeme != lex_open_brace) {
    pcVar18 = "Unrecognized function call";
    goto switchD_00129b33_caseD_64;
  }
  xpath_lexer::next(this_00);
  lVar17 = (this->_lexer)._cur_lexeme;
  uVar20 = 0;
  pxVar9 = (xpath_ast_node *)0x0;
  pxVar12 = (xpath_ast_node *)0x0;
  if (lVar17 != lex_close_brace) {
    uVar20 = 0;
    pxVar11 = (xpath_ast_node *)0x0;
    do {
      if (uVar20 == 0) {
        pxVar14 = parse_expression(this,0);
        if (pxVar14 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
LAB_00129ae8:
        local_48[uVar20] = pxVar14;
      }
      else {
        if (lVar17 != lex_comma) {
          pcVar18 = "No comma between function arguments";
          goto switchD_00129b33_caseD_64;
        }
        xpath_lexer::next(this_00);
        pxVar14 = parse_expression(this,0);
        if (pxVar14 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if (uVar20 == 1) goto LAB_00129ae8;
        pxVar11->_next = pxVar14;
      }
      uVar20 = uVar20 + 1;
      lVar17 = (this->_lexer)._cur_lexeme;
      pxVar9 = local_48[1];
      pxVar12 = local_48[0];
      pxVar11 = pxVar14;
    } while (lVar17 != lex_close_brace);
  }
  xpath_lexer::next(this_00);
  pcVar18 = "Unrecognized function or wrong parameter count";
  switch(*pcVar2) {
  case 'b':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("boolean"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 != 1) || ("boolean"[lVar15] != '\0')) break;
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '-';
    pxVar11->_rettype = '\x04';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
LAB_00129e39:
    pxVar11->_left = pxVar12;
    goto LAB_0012a50a;
  case 'c':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("pos == count"[lVar19 + 7] != pcVar2[lVar19]) goto LAB_0012a158;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 != 1) || ("pos == count"[lVar15 + 7] != '\0')) {
LAB_0012a158:
      if (pcVar10 != pcVar2) {
        lVar19 = 0;
        do {
          if ("contains"[lVar19] != pcVar2[lVar19]) goto LAB_0012a1b0;
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      if ((uVar20 == 2) && ("contains"[lVar15] == '\0')) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '#';
        pxVar11->_rettype = '\x04';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
      }
      else {
LAB_0012a1b0:
        if (pcVar10 != pcVar2) {
          lVar19 = 0;
          do {
            if ("concat"[lVar19] != pcVar2[lVar19]) goto LAB_0012a3b3;
            lVar19 = lVar19 + 1;
          } while (lVar15 != lVar19);
        }
        if ((uVar20 < 2) || ("concat"[lVar15] != '\0')) {
LAB_0012a3b3:
          if (pcVar10 != pcVar2) {
            lVar19 = 0;
            do {
              if ("ceiling"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
              lVar19 = lVar19 + 1;
            } while (lVar15 != lVar19);
          }
          if (uVar20 == 1 && "ceiling"[lVar15] == '\0') {
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '6';
            pxVar11->_rettype = '\x02';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
            goto LAB_0012a501;
          }
          break;
        }
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar11->_type = '!';
        pxVar11->_rettype = '\x03';
        pxVar11->_axis = '\0';
        pxVar11->_test = '\0';
      }
LAB_0012a642:
      pxVar11->_left = pxVar12;
LAB_0012a64b:
      pxVar11->_right = pxVar9;
LAB_0012a654:
      pxVar11->_next = (xpath_ast_node *)0x0;
      goto LAB_001298de;
    }
    if (pxVar12->_rettype != '\x01') goto LAB_0012a6d0;
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x17';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    goto LAB_0012a501;
  case 'f':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("false"[lVar19] != pcVar2[lVar19]) goto LAB_00129f8f;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 0) && ("false"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '0';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
LAB_0012a056:
      pxVar11->_left = (xpath_ast_node *)0x0;
      pxVar11->_right = (xpath_ast_node *)0x0;
      goto LAB_0012a654;
    }
LAB_00129f8f:
    if (pcVar10 != pcVar2) {
      lVar19 = 0;
      do {
        if ("floor"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 1) && ("floor"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '5';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012a501;
    }
    break;
  case 'i':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("basic_string::_M_construct null not valid"[lVar19 + 0x27] != pcVar2[lVar19])
        goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 1) && ("basic_string::_M_construct null not valid"[lVar15 + 0x27] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x18';
      pxVar11->_rettype = '\x01';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_00129e39;
    }
    break;
  case 'l':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("last"[lVar19] != pcVar2[lVar19]) goto LAB_0012a21c;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 0) && ("last"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x15';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012a056;
    }
LAB_0012a21c:
    if (pcVar10 != pcVar2) {
      lVar19 = 0;
      do {
        if ("xml:lang"[lVar19 + 4] != pcVar2[lVar19]) goto LAB_0012a41c;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 != 1) || ("xml:lang"[lVar15 + 4] != '\0')) {
LAB_0012a41c:
      if (pcVar10 != pcVar2) {
        lVar19 = 0;
        do {
          if ("local-name"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      if ((1 < uVar20) || ("local-name"[lVar15] != '\0')) break;
      if ((uVar20 == 1) && (pxVar12->_rettype != '\x01')) goto LAB_0012a6d0;
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar5 = '\x1a' - (uVar20 == 0);
      goto LAB_0012a0da;
    }
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '1';
    pxVar11->_rettype = '\x04';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    goto LAB_0012a501;
  case 'n':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("Unknown variable: variable set does not contain the given name"[lVar19 + 0x3a] !=
            pcVar2[lVar19]) goto LAB_0012a06a;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 < 2) &&
       ("Unknown variable: variable set does not contain the given name"[lVar15 + 0x3a] == '\0')) {
      if ((uVar20 != 1) || (pxVar12->_rettype == '\x01')) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar5 = '\x1e';
        goto LAB_0012a0d8;
      }
    }
    else {
LAB_0012a06a:
      bVar16 = 1 < uVar20;
      if (pcVar10 != pcVar2) {
        lVar19 = 0;
        do {
          if ("namespace-uri"[lVar19] != pcVar2[lVar19]) goto LAB_0012a0e9;
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      if (bVar16 || "namespace-uri"[lVar15] != '\0') {
LAB_0012a0e9:
        if (pcVar10 != pcVar2) {
          lVar19 = 0;
          do {
            if ("normalize-space"[lVar19] != pcVar2[lVar19]) goto LAB_0012a34f;
            lVar19 = lVar19 + 1;
          } while (lVar15 != lVar19);
        }
        if (!bVar16 && "normalize-space"[lVar15] == '\0') {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar6 = uVar20 == 0 ^ 0x2b;
LAB_0012a633:
          pxVar11->_type = bVar6;
          pxVar11->_rettype = '\x03';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
          goto LAB_0012a642;
        }
LAB_0012a34f:
        if (pcVar10 != pcVar2) {
          lVar19 = 0;
          do {
            if ("not"[lVar19] != pcVar2[lVar19]) goto LAB_0012a493;
            lVar19 = lVar19 + 1;
          } while (lVar15 != lVar19);
        }
        if ((uVar20 == 1) && ("not"[lVar15] == '\0')) {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar11->_type = '.';
          pxVar11->_rettype = '\x04';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
          goto LAB_0012a501;
        }
LAB_0012a493:
        if (pcVar10 != pcVar2) {
          lVar19 = 0;
          do {
            if ("expr->rettype() == xpath_type_number"[lVar19 + 0x1e] != pcVar2[lVar19])
            goto switchD_00129b33_caseD_64;
            lVar19 = lVar19 + 1;
          } while (lVar15 != lVar19);
        }
        if (!bVar16 && "expr->rettype() == xpath_type_number"[lVar15 + 0x1e] == '\0') {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar6 = uVar20 == 0 ^ 0x33;
          goto LAB_0012a4f2;
        }
        break;
      }
      if ((uVar20 != 1) || (pxVar12->_rettype == '\x01')) {
        pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar11 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar5 = '\x1c';
        goto LAB_0012a0d8;
      }
    }
LAB_0012a6d0:
    pcVar18 = "Function has to be applied to node set";
    break;
  case 'p':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("position"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 0) && ("position"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x16';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012a056;
    }
    break;
  case 'r':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("round"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 1) && ("round"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '7';
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_00129e39;
    }
    break;
  case 's':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("exponent_string"[lVar19 + 9] != pcVar2[lVar19]) goto LAB_0012a28a;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 < 2) && ("exponent_string"[lVar15 + 9] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar5 = ' ';
LAB_0012a0d8:
      cVar5 = cVar5 - (uVar20 == 0);
LAB_0012a0da:
      pxVar11->_type = cVar5;
      pxVar11->_rettype = '\x03';
      pxVar11->_axis = '\0';
    }
    else {
LAB_0012a28a:
      if (pcVar10 != pcVar2) {
        lVar19 = 0;
        do {
          if ("string-length"[lVar19] != pcVar2[lVar19]) goto LAB_0012a2e6;
          lVar19 = lVar19 + 1;
        } while (lVar15 != lVar19);
      }
      if (1 < uVar20 || "string-length"[lVar15] != '\0') {
LAB_0012a2e6:
        if (pcVar10 != pcVar2) {
          lVar19 = 0;
          do {
            if ("starts-with"[lVar19] != pcVar2[lVar19]) goto LAB_0012a520;
            lVar19 = lVar19 + 1;
          } while (lVar15 != lVar19);
        }
        if ((uVar20 == 2) && ("starts-with"[lVar15] == '\0')) {
          pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar11 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar11->_type = '\"';
          pxVar11->_rettype = '\x04';
          pxVar11->_axis = '\0';
          pxVar11->_test = '\0';
        }
        else {
LAB_0012a520:
          local_59 = uVar20 == 2;
          if (pcVar10 != pcVar2) {
            lVar19 = 0;
            do {
              if ("substring-before"[lVar19] != pcVar2[lVar19]) goto LAB_0012a57e;
              lVar19 = lVar19 + 1;
            } while (lVar15 != lVar19);
          }
          if (local_59 && "substring-before"[lVar15] == '\0') {
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '$';
            pxVar11->_rettype = '\x03';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
          }
          else {
LAB_0012a57e:
            if (pcVar10 != pcVar2) {
              lVar19 = 0;
              do {
                if ("substring-after"[lVar19] != pcVar2[lVar19]) goto LAB_0012a5d9;
                lVar19 = lVar19 + 1;
              } while (lVar15 != lVar19);
            }
            if (!local_59 || "substring-after"[lVar15] != '\0') {
LAB_0012a5d9:
              if (pcVar10 != pcVar2) {
                lVar19 = 0;
                do {
                  if ("substring"[lVar19] != pcVar2[lVar19]) goto LAB_0012a661;
                  lVar19 = lVar19 + 1;
                } while (lVar15 != lVar19);
              }
              if (((uVar20 & 0xfffffffffffffffe) == 2) && ("substring"[lVar15] == '\0')) {
                pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar11 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                bVar6 = local_59 ^ 0x27;
                goto LAB_0012a633;
              }
LAB_0012a661:
              if (pcVar10 != pcVar2) {
                lVar19 = 0;
                do {
                  if ("sum"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
                  lVar19 = lVar19 + 1;
                } while (lVar15 != lVar19);
              }
              if ((uVar20 == 1) && ("sum"[lVar15] == '\0')) {
                if (pxVar12->_rettype != '\x01') goto LAB_0012a6d0;
                pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar11 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                pxVar11->_type = '4';
                pxVar11->_rettype = '\x02';
                pxVar11->_axis = '\0';
                pxVar11->_test = '\0';
                goto LAB_0012a501;
              }
              break;
            }
            pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar11 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar11->_type = '%';
            pxVar11->_rettype = '\x03';
            pxVar11->_axis = '\0';
            pxVar11->_test = '\0';
          }
        }
        goto LAB_0012a642;
      }
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar6 = uVar20 == 0 ^ 0x29;
LAB_0012a4f2:
      pxVar11->_type = bVar6;
      pxVar11->_rettype = '\x02';
      pxVar11->_axis = '\0';
    }
    pxVar11->_test = '\0';
LAB_0012a501:
    pxVar11->_left = pxVar12;
LAB_0012a50a:
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
LAB_001298de:
    lVar17 = (this->_lexer)._cur_lexeme;
    while (lVar17 == lex_open_square_brace) {
      xpath_lexer::next(this_00);
      if (pxVar11->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar18 = "Predicate has to be applied to node set";
        goto LAB_00129a29;
      }
      pxVar9 = parse_expression(this,0);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar12 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar12->_type = '\x11';
      pxVar12->_rettype = '\x01';
      pxVar12->_axis = '\0';
      pxVar12->_test = '\0';
      pxVar12->_left = pxVar11;
      pxVar12->_right = pxVar9;
      pxVar12->_next = (xpath_ast_node *)0x0;
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar13 = this->_result;
        pcVar18 = "Expected \']\' to match an opening \'[\'";
        goto LAB_00129a29;
      }
      xpath_lexer::next(this_00);
      pxVar11 = pxVar12;
      lVar17 = (this->_lexer)._cur_lexeme;
    }
    if (lVar17 != lex_double_slash) {
      if (lVar17 != lex_slash) {
        return pxVar11;
      }
      xpath_lexer::next(this_00);
      pxVar9 = pxVar11;
LAB_001299de:
      pxVar9 = parse_relative_location_path(this,pxVar9);
      return pxVar9;
    }
    xpath_lexer::next(this_00);
    if (pxVar11->_rettype == '\x01') {
      pxVar9 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar9 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar9->_type = '8';
      pxVar9->_rettype = '\x01';
      pxVar9->_axis = '\x05';
      pxVar9->_test = '\x02';
      pxVar9->_left = pxVar11;
      pxVar9->_right = (xpath_ast_node *)0x0;
      pxVar9->_next = (xpath_ast_node *)0x0;
      (pxVar9->_data).string = (char_t *)0x0;
      goto LAB_001299de;
    }
    pxVar13 = this->_result;
    pcVar18 = "Step has to be applied to node set";
LAB_00129a29:
    pxVar13->error = pcVar18;
    goto LAB_00129a2c;
  case 't':
    lVar15 = (long)pcVar10 - (long)pcVar2;
    if (lVar15 != 0) {
      lVar19 = 0;
      do {
        if ("translate"[lVar19] != pcVar2[lVar19]) goto LAB_00129ff8;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 3) && ("translate"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = ',';
      pxVar11->_rettype = '\x03';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      pxVar11->_left = pxVar12;
      goto LAB_0012a64b;
    }
LAB_00129ff8:
    if (pcVar10 != pcVar2) {
      lVar19 = 0;
      do {
        if ("true"[lVar19] != pcVar2[lVar19]) goto switchD_00129b33_caseD_64;
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
    if ((uVar20 == 0) && ("true"[lVar15] == '\0')) {
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '/';
      pxVar11->_rettype = '\x04';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      goto LAB_0012a056;
    }
  }
switchD_00129b33_caseD_64:
  pxVar13 = this->_result;
  pxVar13->error = pcVar18;
LAB_00129a2c:
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}